

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int ptls_hkdf_extract(ptls_hash_algorithm_t *algo,void *output,ptls_iovec_t salt,ptls_iovec_t ikm)

{
  ptls_hash_context_t *ppVar1;
  void *in_RCX;
  uint8_t *in_RDX;
  void *in_RSI;
  long in_RDI;
  void *in_R8;
  size_t in_R9;
  ptls_iovec_t pVar2;
  ptls_hash_context_t *hash;
  uint8_t *local_50;
  void *local_48;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar3;
  
  if (in_RCX == (void *)0x0) {
    pVar2 = ptls_iovec_init("",*(size_t *)(in_RDI + 8));
    local_50 = pVar2.base;
    local_48 = (void *)pVar2.len;
    in_RDX = local_50;
    in_RCX = local_48;
  }
  ppVar1 = ptls_hmac_create((ptls_hash_algorithm_t *)
                            CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RCX,
                            (size_t)in_RDX);
  if (ppVar1 == (ptls_hash_context_t *)0x0) {
    iVar3 = 0x201;
  }
  else {
    (*ppVar1->update)(ppVar1,in_R8,in_R9);
    (*ppVar1->final)(ppVar1,in_RSI,PTLS_HASH_FINAL_MODE_FREE);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int ptls_hkdf_extract(ptls_hash_algorithm_t *algo, void *output, ptls_iovec_t salt, ptls_iovec_t ikm)
{
    ptls_hash_context_t *hash;

    if (salt.len == 0)
        salt = ptls_iovec_init(zeroes_of_max_digest_size, algo->digest_size);

    if ((hash = ptls_hmac_create(algo, salt.base, salt.len)) == NULL)
        return PTLS_ERROR_NO_MEMORY;
    hash->update(hash, ikm.base, ikm.len);
    hash->final(hash, output, PTLS_HASH_FINAL_MODE_FREE);
    return 0;
}